

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceGroup * __thiscall cmMakefile::GetOrCreateSourceGroup(cmMakefile *this,string *name)

{
  string_view sep;
  string_view str;
  bool bVar1;
  string *psVar2;
  cmSourceGroup *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  allocator<char> local_61;
  string local_60;
  cmValue local_40;
  cmValue p;
  string delimiters;
  string *name_local;
  cmMakefile *this_local;
  
  std::__cxx11::string::string((string *)&p);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"SOURCE_GROUP_DELIMITER",&local_61);
  local_40 = GetDefinition(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = cmValue::operator_cast_to_bool(&local_40);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_40);
    std::__cxx11::string::operator=((string *)&p,(string *)psVar2);
  }
  else {
    std::__cxx11::string::operator=((string *)&p,"/\\");
  }
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
  sep = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&p);
  cmTokenize_abi_cxx11_(&local_90,str,sep);
  pcVar3 = GetOrCreateSourceGroup(this,&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::__cxx11::string::~string((string *)&p);
  return pcVar3;
}

Assistant:

cmSourceGroup* cmMakefile::GetOrCreateSourceGroup(const std::string& name)
{
  std::string delimiters;
  if (cmValue p = this->GetDefinition("SOURCE_GROUP_DELIMITER")) {
    delimiters = *p;
  } else {
    delimiters = "/\\";
  }
  return this->GetOrCreateSourceGroup(cmTokenize(name, delimiters));
}